

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall cmCPackIFWInstaller::ConfigureFromOptions(cmCPackIFWInstaller *this)

{
  string *__lhs;
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_00;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  allocator local_1ba;
  allocator local_1b9;
  string local_1b8;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_NAME",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_NAME",(allocator *)&local_1b8);
    cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  }
  std::__cxx11::string::assign((char *)&this->Name);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_TITLE",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DESCRIPTION_SUMMARY",(allocator *)&local_1b8
              );
    cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  }
  std::__cxx11::string::assign((char *)&this->Title);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_VERSION",(allocator *)&local_1b8);
  cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::assign((char *)&this->Version);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_PUBLISHER",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_VENDOR",(allocator *)&local_1b8);
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar3 != (char *)0x0) goto LAB_002d7061;
  }
  else {
LAB_002d7061:
    std::__cxx11::string::assign((char *)&this->Publisher);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PRODUCT_URL",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->ProductUrl);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_ICON",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&this->InstallerApplicationIcon);
    }
    else {
      std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_ICON",&local_1b9);
      std::__cxx11::string::string((string *)&local_1b8,pcVar3,&local_1ba);
      printSkippedOptionWarning(this,(string *)&cmCPackLog_msg,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_WINDOW_ICON",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&this->InstallerWindowIcon);
    }
    else {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_WINDOW_ICON",&local_1b9);
      std::__cxx11::string::string((string *)&local_1b8,pcVar3,&local_1ba);
      printSkippedOptionWarning(this,(string *)&cmCPackLog_msg,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_LOGO",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&this->Logo);
    }
    else {
      std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_LOGO",&local_1b9);
      std::__cxx11::string::string((string *)&local_1b8,pcVar3,&local_1ba);
      printSkippedOptionWarning(this,(string *)&cmCPackLog_msg,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_WATERMARK",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&this->Watermark);
    }
    else {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_WATERMARK",&local_1b9);
      std::__cxx11::string::string((string *)&local_1b8,pcVar3,&local_1ba);
      printSkippedOptionWarning(this,(string *)&cmCPackLog_msg,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_BANNER",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&this->Banner);
    }
    else {
      std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_BANNER",&local_1b9);
      std::__cxx11::string::string((string *)&local_1b8,pcVar3,&local_1ba);
      printSkippedOptionWarning(this,(string *)&cmCPackLog_msg,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_BACKGROUND",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&this->Background);
    }
    else {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_BACKGROUND",&local_1b9);
      std::__cxx11::string::string((string *)&local_1b8,pcVar3,&local_1ba);
      printSkippedOptionWarning(this,(string *)&cmCPackLog_msg,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_WIZARD_STYLE",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    __lhs = &this->WizardStyle;
    std::__cxx11::string::assign((char *)__lhs);
    bVar2 = std::operator!=(__lhs,"Modern");
    if ((((bVar2) && (bVar2 = std::operator!=(__lhs,"Aero"), bVar2)) &&
        (bVar2 = std::operator!=(__lhs,"Mac"), bVar2)) &&
       (bVar2 = std::operator!=(__lhs,"Classic"), bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "Option CPACK_IFW_PACKAGE_WIZARD_STYLE has unknown value \"");
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"\". Expected values are: Modern, Aero, Mac, Classic.");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
        this_00 = (pcVar1->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(this_00,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                        ,0x8e,local_1b8._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_WIZARD_DEFAULT_WIDTH",
             (allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->WizardDefaultWidth);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_WIZARD_DEFAULT_HEIGHT",
             (allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->WizardDefaultHeight);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_TITLE_COLOR",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->TitleColor);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_START_MENU_DIRECTORY",
             (allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->StartMenuDir);
  }
  else {
    std::__cxx11::string::assign((char *)&this->StartMenuDir);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_TARGET_DIRECTORY",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_INSTALL_DIRECTORY",(allocator *)&local_1b8);
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->TargetDir);
      std::__cxx11::string::append((char *)&this->TargetDir);
      goto LAB_002d7766;
    }
  }
  std::__cxx11::string::assign((char *)&this->TargetDir);
LAB_002d7766:
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_ADMIN_TARGET_DIRECTORY",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->AdminTargetDir);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME",
             (allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->MaintenanceToolName);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE",
             (allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->MaintenanceToolIniFile);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS",
             (allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS",
               (allocator *)&local_1b8);
    cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::assign((char *)&this->AllowNonAsciiCharacters);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH",
             (allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH",
               (allocator *)&local_1b8);
    cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::assign((char *)&this->AllowSpaceInPath);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_CONTROL_SCRIPT",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->ControlScript);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGE_RESOURCES",(allocator *)&local_1b8);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Resources);
    std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar3,(allocator *)&local_1b8);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&this->Resources,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::ConfigureFromOptions()
{
  // Name;
  if (const char* optIFW_PACKAGE_NAME =
        this->GetOption("CPACK_IFW_PACKAGE_NAME")) {
    this->Name = optIFW_PACKAGE_NAME;
  } else if (const char* optPACKAGE_NAME =
               this->GetOption("CPACK_PACKAGE_NAME")) {
    this->Name = optPACKAGE_NAME;
  } else {
    this->Name = "Your package";
  }

  // Title;
  if (const char* optIFW_PACKAGE_TITLE =
        this->GetOption("CPACK_IFW_PACKAGE_TITLE")) {
    this->Title = optIFW_PACKAGE_TITLE;
  } else if (const char* optPACKAGE_DESCRIPTION_SUMMARY =
               this->GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY")) {
    this->Title = optPACKAGE_DESCRIPTION_SUMMARY;
  } else {
    this->Title = "Your package description";
  }

  // Version;
  if (const char* option = this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = option;
  } else {
    this->Version = "1.0.0";
  }

  // Publisher
  if (const char* optIFW_PACKAGE_PUBLISHER =
        this->GetOption("CPACK_IFW_PACKAGE_PUBLISHER")) {
    this->Publisher = optIFW_PACKAGE_PUBLISHER;
  } else if (const char* optPACKAGE_VENDOR =
               GetOption("CPACK_PACKAGE_VENDOR")) {
    this->Publisher = optPACKAGE_VENDOR;
  }

  // ProductUrl
  if (const char* option = this->GetOption("CPACK_IFW_PRODUCT_URL")) {
    this->ProductUrl = option;
  }

  // ApplicationIcon
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_ICON")) {
    if (cmSystemTools::FileExists(option)) {
      this->InstallerApplicationIcon = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_ICON", option);
    }
  }

  // WindowIcon
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WINDOW_ICON")) {
    if (cmSystemTools::FileExists(option)) {
      this->InstallerWindowIcon = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_WINDOW_ICON", option);
    }
  }

  // Logo
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_LOGO")) {
    if (cmSystemTools::FileExists(option)) {
      this->Logo = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_LOGO", option);
    }
  }

  // Watermark
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WATERMARK")) {
    if (cmSystemTools::FileExists(option)) {
      this->Watermark = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_WATERMARK", option);
    }
  }

  // Banner
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_BANNER")) {
    if (cmSystemTools::FileExists(option)) {
      this->Banner = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_BANNER", option);
    }
  }

  // Background
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_BACKGROUND")) {
    if (cmSystemTools::FileExists(option)) {
      this->Background = option;
    } else {
      this->printSkippedOptionWarning("CPACK_IFW_PACKAGE_BACKGROUND", option);
    }
  }

  // WizardStyle
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_WIZARD_STYLE")) {
    // Setting the user value in any case
    this->WizardStyle = option;
    // Check known values
    if (this->WizardStyle != "Modern" && this->WizardStyle != "Aero" &&
        this->WizardStyle != "Mac" && this->WizardStyle != "Classic") {
      cmCPackIFWLogger(
        WARNING, "Option CPACK_IFW_PACKAGE_WIZARD_STYLE has unknown value \""
          << option << "\". Expected values are: Modern, Aero, Mac, Classic."
          << std::endl);
    }
  }

  // WizardDefaultWidth
  if (const char* option =
        this->GetOption("CPACK_IFW_PACKAGE_WIZARD_DEFAULT_WIDTH")) {
    this->WizardDefaultWidth = option;
  }

  // WizardDefaultHeight
  if (const char* option =
        this->GetOption("CPACK_IFW_PACKAGE_WIZARD_DEFAULT_HEIGHT")) {
    this->WizardDefaultHeight = option;
  }

  // TitleColor
  if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_TITLE_COLOR")) {
    this->TitleColor = option;
  }

  // Start menu
  if (const char* optIFW_START_MENU_DIR =
        this->GetOption("CPACK_IFW_PACKAGE_START_MENU_DIRECTORY")) {
    this->StartMenuDir = optIFW_START_MENU_DIR;
  } else {
    this->StartMenuDir = Name;
  }

  // Default target directory for installation
  if (const char* optIFW_TARGET_DIRECTORY =
        this->GetOption("CPACK_IFW_TARGET_DIRECTORY")) {
    this->TargetDir = optIFW_TARGET_DIRECTORY;
  } else if (const char* optPACKAGE_INSTALL_DIRECTORY =
               this->GetOption("CPACK_PACKAGE_INSTALL_DIRECTORY")) {
    this->TargetDir = "@ApplicationsDir@/";
    this->TargetDir += optPACKAGE_INSTALL_DIRECTORY;
  } else {
    this->TargetDir = "@RootDir@/usr/local";
  }

  // Default target directory for installation with administrator rights
  if (const char* option =
        this->GetOption("CPACK_IFW_ADMIN_TARGET_DIRECTORY")) {
    this->AdminTargetDir = option;
  }

  // Maintenance tool
  if (const char* optIFW_MAINTENANCE_TOOL =
        this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME")) {
    this->MaintenanceToolName = optIFW_MAINTENANCE_TOOL;
  }

  // Maintenance tool ini file
  if (const char* optIFW_MAINTENANCE_TOOL_INI =
        this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE")) {
    this->MaintenanceToolIniFile = optIFW_MAINTENANCE_TOOL_INI;
  }

  // Allow non-ASCII characters
  if (this->GetOption("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS")) {
    if (this->IsOn("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS")) {
      this->AllowNonAsciiCharacters = "true";
    } else {
      this->AllowNonAsciiCharacters = "false";
    }
  }

  // Space in path
  if (this->GetOption("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH")) {
    if (this->IsOn("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH")) {
      this->AllowSpaceInPath = "true";
    } else {
      this->AllowSpaceInPath = "false";
    }
  }

  // Control script
  if (const char* optIFW_CONTROL_SCRIPT =
        this->GetOption("CPACK_IFW_PACKAGE_CONTROL_SCRIPT")) {
    this->ControlScript = optIFW_CONTROL_SCRIPT;
  }

  // Resources
  if (const char* optIFW_PACKAGE_RESOURCES =
        this->GetOption("CPACK_IFW_PACKAGE_RESOURCES")) {
    this->Resources.clear();
    cmSystemTools::ExpandListArgument(optIFW_PACKAGE_RESOURCES,
                                      this->Resources);
  }
}